

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bar.cpp
# Opt level: O2

void __thiscall BmsBarManager::SetResolution(BmsBarManager *this,double d)

{
  mapped_type *pmVar1;
  long lVar2;
  undefined8 uStack_28;
  
  this->barresolution_ = (uint)(long)((double)this->barresolution_ * d);
  for (uStack_28 = 0; uStack_28 != 1000; uStack_28 = uStack_28 + 1) {
    this->barcount_[uStack_28] = (uint)(long)((double)this->barcount_[uStack_28] * d);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear(&(this->barcache_)._M_t);
  uStack_28 = uStack_28 & 0xffffffff;
  for (lVar2 = 0;
      pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](&this->barcache_,(key_type *)((long)&uStack_28 + 4)), lVar2 != 1000;
      lVar2 = lVar2 + 1) {
    *pmVar1 = (mapped_type)lVar2;
    uStack_28 = CONCAT44(uStack_28._4_4_ + this->barcount_[lVar2],(undefined4)uStack_28);
  }
  *pmVar1 = 1000;
  return;
}

Assistant:

void
BmsBarManager::SetResolution(double d)
{
	barresolution_ *= d;

	// make every cache size reseted and InvalidateCache
	for (int i = 0; i < BmsConst::BAR_MAX_COUNT; i++)
		barcount_[i] *= d;

	// invalidate cache
	InvalidateCache();
}